

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t anon_unknown.dwarf_1780b::determineArrayType(bool needIndexTable,ValueLength offsetSize)

{
  uint8_t type;
  ValueLength offsetSize_local;
  bool needIndexTable_local;
  
  if (needIndexTable) {
    type = '\x06';
  }
  else {
    type = '\x02';
  }
  if (offsetSize == 2) {
    type = type + '\x01';
  }
  else if (offsetSize == 4) {
    type = type + '\x02';
  }
  else if (offsetSize == 8) {
    type = type + '\x03';
  }
  return type;
}

Assistant:

uint8_t determineArrayType(bool needIndexTable, ValueLength offsetSize) {
  uint8_t type;
  // Now build the table:
  if (needIndexTable) {
    type = 0x06;
  } else {  // no index table
    type = 0x02;
  }
  // Finally fix the byte width in the type byte:
  if (offsetSize == 2) {
    type += 1;
  } else if (offsetSize == 4) {
    type += 2;
  } else if (offsetSize == 8) {
    type += 3;
  }
  return type;
}